

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAtomicCounterTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::atomic_precision
               (NegativeTestContext *ctx)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "It is an error to declare an atomic type with a lowp or mediump precision.","");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  iterateShaders(ctx,TESTCASE_LAYOUT_MEDIUMP_PRECISION);
  iterateShaders(ctx,TESTCASE_LAYOUT_LOWP_PRECISION);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void atomic_precision (NegativeTestContext& ctx)
{
	ctx.beginSection("It is an error to declare an atomic type with a lowp or mediump precision.");
	iterateShaders(ctx, TESTCASE_LAYOUT_MEDIUMP_PRECISION);
	iterateShaders(ctx, TESTCASE_LAYOUT_LOWP_PRECISION);
	ctx.endSection();
}